

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O0

void __thiscall
bidirectional::BiDirectional::BiDirectional
          (BiDirectional *this,int *number_vertices,int *number_edges,int *source_id,int *sink_id,
          vector<double,_std::allocator<double>_> *max_res_in,
          vector<double,_std::allocator<double>_> *min_res_in)

{
  element_type *this_00;
  vector<double,_std::allocator<double>_> *in_RDI;
  pointer pdVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff20;
  pointer *__args;
  int *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  allocator<char> *__a;
  string *pattern;
  logger *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  allocator<char> local_79 [53];
  undefined4 local_44;
  undefined4 local_40;
  
  this_02 = in_RDI;
  std::vector<double,_std::allocator<double>_>::vector(in_RDI,in_RDI);
  std::vector<double,_std::allocator<double>_>::vector(this_02,in_RDI);
  this_01 = (logger *)
            &in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::make_unique<bidirectional::Params>();
  pattern = (string *)
            &in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::make_unique<bidirectional::DiGraph,int_const&,int_const&,int_const&,int_const&>
            ((int *)pattern,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_ffffffffffffff20);
  pdVar1 = (pointer)nan("nan");
  in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar1;
  *(undefined4 *)
   &in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = 0;
  *(undefined1 *)
   ((long)&in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  __args = &in_RDI[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x244527);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x24453a);
  std::shared_ptr<labelling::Label>::shared_ptr((shared_ptr<labelling::Label> *)0x244550);
  __a = (allocator<char> *)(in_RDI + 7);
  local_40 = 0;
  std::make_unique<bidirectional::Search,bidirectional::Directions>((Directions *)__args);
  local_44 = 1;
  std::make_unique<bidirectional::Search,bidirectional::Directions>((Directions *)__args);
  spdlog::default_logger();
  this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2445c2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
             (char *)pattern,__a);
  spdlog::logger::set_pattern(this_01,pattern,(pattern_time_type)((ulong)__a >> 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_79);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x244622);
  return;
}

Assistant:

BiDirectional::BiDirectional(
    const int&                 number_vertices,
    const int&                 number_edges,
    const int&                 source_id,
    const int&                 sink_id,
    const std::vector<double>& max_res_in,
    const std::vector<double>& min_res_in)
    : max_res(max_res_in),
      min_res(min_res_in),
      // Private pointer initialisations
      params_ptr_(std::make_unique<bidirectional::Params>()),
      graph_ptr_(std::make_unique<DiGraph>(
          number_vertices,
          number_edges,
          source_id,
          sink_id)),
      fwd_search_ptr_(std::make_unique<bidirectional::Search>(FWD)),
      bwd_search_ptr_(std::make_unique<bidirectional::Search>(BWD)) {
#if SPDLOG_ACTIVE_LEVEL == SPDLOG_LEVEL_DEBUG
  // Needed as not printed otherwise
  spdlog::set_level(spdlog::level::debug);
#endif
  spdlog::default_logger()->set_pattern("%v");
  SPDLOG_INFO(
      "************************************************************************"
      "********");
  // spdlog::set_pattern("%+"); // back to default format
}